

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
TransformPromiseNode<kj::_::Void,_kj::Own<kj::AsyncIoStream>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++:652:13),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::_::Void,_kj::Own<kj::AsyncIoStream>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_test_c__:652:13),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  AsyncIoStream *extraout_RDX;
  ExceptionOr<kj::Own<kj::AsyncIoStream>_> *pEVar1;
  Own<kj::AsyncIoStream> OVar2;
  ExceptionOr<kj::Own<kj::AsyncIoStream>_> depResult;
  ExceptionOr<kj::Own<kj::AsyncIoStream>_> local_5a8;
  Exception local_438;
  ExceptionOr<kj::_::Void> local_2e0;
  Exception local_178;
  
  pEVar1 = &local_5a8;
  local_5a8.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_5a8.value.ptr.disposer = (Disposer *)0x0;
  local_5a8.value.ptr.ptr = (AsyncIoStream *)0x0;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&local_5a8.super_ExceptionOrValue);
  if (local_5a8.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::Exception(&local_178,&local_5a8.super_ExceptionOrValue.exception.ptr.field_1.value);
    local_438.ownFile.content.ptr = local_178.ownFile.content.ptr;
    local_438.ownFile.content.size_ = local_178.ownFile.content.size_;
    local_438.ownFile.content.disposer = local_178.ownFile.content.disposer;
    local_178.ownFile.content.ptr = (char *)0x0;
    local_178.ownFile.content.size_ = 0;
    local_438.file = local_178.file;
    local_438.line = local_178.line;
    local_438.type = local_178.type;
    local_438.description.content.ptr = local_178.description.content.ptr;
    local_438.description.content.size_ = local_178.description.content.size_;
    local_178.description.content.ptr = (char *)0x0;
    local_178.description.content.size_ = 0;
    local_438.description.content.disposer = local_178.description.content.disposer;
    local_438.context.ptr.disposer = local_178.context.ptr.disposer;
    local_438.context.ptr.ptr = local_178.context.ptr.ptr;
    local_178.context.ptr.ptr = (Context *)0x0;
    memcpy(local_438.trace,local_178.trace,0x104);
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_2e0,&local_438);
    local_2e0.value.ptr.isSet = false;
    Exception::~Exception(&local_438);
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_2e0);
    NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_2e0);
    Exception::~Exception(&local_178);
  }
  else if (local_5a8.value.ptr.ptr != (AsyncIoStream *)0x0) {
    local_438.ownFile.content.ptr = (char *)local_5a8.value.ptr.disposer;
    local_438.ownFile.content.size_ = (size_t)local_5a8.value.ptr.ptr;
    local_5a8.value.ptr.ptr = (AsyncIoStream *)0x0;
    OVar2.ptr = extraout_RDX;
    OVar2.disposer = (Disposer *)pEVar1;
    anon_class_1_0_00000001_for_func::operator()((anon_class_1_0_00000001_for_func *)this,OVar2);
    Own<kj::AsyncIoStream>::dispose((Own<kj::AsyncIoStream> *)&local_438);
    local_2e0.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_2e0.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_2e0);
    NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_2e0);
  }
  ExceptionOr<kj::Own<kj::AsyncIoStream>_>::~ExceptionOr(&local_5a8);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }